

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

void LZ4HC_init_internal(LZ4HC_CCtx_internal *hc4,BYTE *start)

{
  long lVar1;
  LZ4_u32 LVar2;
  ulong local_20;
  uptrval startingOffset;
  BYTE *start_local;
  LZ4HC_CCtx_internal *hc4_local;
  
  local_20 = (long)hc4->end - (long)hc4->base;
  if (0x40000000 < local_20) {
    LZ4HC_clearTables(hc4);
    local_20 = 0;
  }
  lVar1 = local_20 + 0x10000;
  LVar2 = (LZ4_u32)lVar1;
  hc4->nextToUpdate = LVar2;
  hc4->base = start + -lVar1;
  hc4->end = start;
  hc4->dictBase = start + -lVar1;
  hc4->dictLimit = LVar2;
  hc4->lowLimit = LVar2;
  return;
}

Assistant:

static void LZ4HC_init_internal (LZ4HC_CCtx_internal* hc4, const BYTE* start)
{
    uptrval startingOffset = (uptrval)(hc4->end - hc4->base);
    if (startingOffset > 1 GB) {
        LZ4HC_clearTables(hc4);
        startingOffset = 0;
    }
    startingOffset += 64 KB;
    hc4->nextToUpdate = (U32) startingOffset;
    hc4->base = start - startingOffset;
    hc4->end = start;
    hc4->dictBase = start - startingOffset;
    hc4->dictLimit = (U32) startingOffset;
    hc4->lowLimit = (U32) startingOffset;
}